

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# syntax_optimizer.cpp
# Opt level: O0

uchar _computeNumberBoolOperation<unsigned_char>(TokenType type,NumberToken *lhs,NumberToken *rhs)

{
  byte bVar1;
  byte bVar2;
  uchar uVar3;
  uchar uVar4;
  allocator<char> local_41;
  string local_40;
  NumberToken *local_20;
  NumberToken *rhs_local;
  NumberToken *lhs_local;
  TokenType type_local;
  
  local_20 = rhs;
  rhs_local = lhs;
  lhs_local._4_2_ = type;
  switch(type) {
  case TOK_OP_EQ:
    uVar3 = pfederc::NumberToken::getNumber<unsigned_char>(lhs);
    uVar4 = pfederc::NumberToken::getNumber<unsigned_char>(local_20);
    lhs_local._7_1_ = uVar3 == uVar4;
    break;
  case TOK_OP_NQ:
    uVar3 = pfederc::NumberToken::getNumber<unsigned_char>(lhs);
    uVar4 = pfederc::NumberToken::getNumber<unsigned_char>(local_20);
    lhs_local._7_1_ = uVar3 != uVar4;
    break;
  case TOK_OP_LT:
    bVar1 = pfederc::NumberToken::getNumber<unsigned_char>(lhs);
    bVar2 = pfederc::NumberToken::getNumber<unsigned_char>(local_20);
    lhs_local._7_1_ = bVar1 < bVar2;
    break;
  case TOK_OP_LEQ:
    bVar1 = pfederc::NumberToken::getNumber<unsigned_char>(lhs);
    bVar2 = pfederc::NumberToken::getNumber<unsigned_char>(local_20);
    lhs_local._7_1_ = bVar1 <= bVar2;
    break;
  case TOK_OP_GT:
    bVar1 = pfederc::NumberToken::getNumber<unsigned_char>(lhs);
    bVar2 = pfederc::NumberToken::getNumber<unsigned_char>(local_20);
    lhs_local._7_1_ = bVar2 < bVar1;
    break;
  case TOK_OP_GEQ:
    bVar1 = pfederc::NumberToken::getNumber<unsigned_char>(lhs);
    bVar2 = pfederc::NumberToken::getNumber<unsigned_char>(local_20);
    lhs_local._7_1_ = bVar2 <= bVar1;
    break;
  default:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_40,"Unknown operation",&local_41);
    pfederc::fatal("/workspace/llm4binary/github/license_all_cmakelists_25/federlang[P]pfederc/libs/pfederc_syntax/src/syntax_optimizer.cpp"
                   ,0xb3,&local_40);
    std::__cxx11::string::~string((string *)&local_40);
    std::allocator<char>::~allocator(&local_41);
    lhs_local._7_1_ = false;
  }
  return lhs_local._7_1_;
}

Assistant:

static R _computeNumberBoolOperation(TokenType type, const NumberToken &lhs, const NumberToken &rhs) {
	switch (type) {
	case TokenType::TOK_OP_LT:
		return lhs.getNumber<R>() < rhs.getNumber<R>();
	case TokenType::TOK_OP_GT:
		return lhs.getNumber<R>() > rhs.getNumber<R>();
	case TokenType::TOK_OP_LEQ:
		return lhs.getNumber<R>() <= rhs.getNumber<R>();
	case TokenType::TOK_OP_GEQ:
		return lhs.getNumber<R>() >= rhs.getNumber<R>();
	case TokenType::TOK_OP_EQ:
		return lhs.getNumber<R>() == rhs.getNumber<R>();
	case TokenType::TOK_OP_NQ:
		return lhs.getNumber<R>() != rhs.getNumber<R>();
	default:
		fatal(__FILE__, __LINE__, "Unknown operation");
		return 0;
	}
}